

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O1

int mbedtls_pk_setup_rsa_alt
              (mbedtls_pk_context *ctx,void *key,mbedtls_pk_rsa_alt_decrypt_func decrypt_func,
              mbedtls_pk_rsa_alt_sign_func sign_func,mbedtls_pk_rsa_alt_key_len_func key_len_func)

{
  int iVar1;
  undefined8 *puVar2;
  
  if (ctx->pk_info != (mbedtls_pk_info_t *)0x0) {
    return -16000;
  }
  puVar2 = (undefined8 *)rsa_alt_alloc_wrap();
  ctx->pk_ctx = puVar2;
  if (puVar2 == (undefined8 *)0x0) {
    iVar1 = -0x3f80;
  }
  else {
    ctx->pk_info = &mbedtls_rsa_alt_info;
    *puVar2 = key;
    puVar2[1] = decrypt_func;
    puVar2[2] = sign_func;
    puVar2[3] = key_len_func;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_setup_rsa_alt( mbedtls_pk_context *ctx, void * key,
                         mbedtls_pk_rsa_alt_decrypt_func decrypt_func,
                         mbedtls_pk_rsa_alt_sign_func sign_func,
                         mbedtls_pk_rsa_alt_key_len_func key_len_func )
{
    mbedtls_rsa_alt_context *rsa_alt;
    const mbedtls_pk_info_t *info = &mbedtls_rsa_alt_info;

    PK_VALIDATE_RET( ctx != NULL );
    if( ctx->pk_info != NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ( ctx->pk_ctx = info->ctx_alloc_func() ) == NULL )
        return( MBEDTLS_ERR_PK_ALLOC_FAILED );

    ctx->pk_info = info;

    rsa_alt = (mbedtls_rsa_alt_context *) ctx->pk_ctx;

    rsa_alt->key = key;
    rsa_alt->decrypt_func = decrypt_func;
    rsa_alt->sign_func = sign_func;
    rsa_alt->key_len_func = key_len_func;

    return( 0 );
}